

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb-c.cpp
# Opt level: O0

duckdb_state duckdb_connect(duckdb_database database,duckdb_connection *out)

{
  Connection *this;
  type database_00;
  undefined8 *in_RSI;
  long in_RDI;
  Connection *connection;
  DatabaseWrapper *wrapper;
  undefined4 local_4;
  
  if ((in_RDI == 0) || (in_RSI == (undefined8 *)0x0)) {
    local_4 = DuckDBError;
  }
  else {
    this = (Connection *)operator_new(0x20);
    database_00 = duckdb::shared_ptr<duckdb::DuckDB,_true>::operator*
                            ((shared_ptr<duckdb::DuckDB,_true> *)this);
    duckdb::Connection::Connection(this,database_00);
    *in_RSI = this;
    local_4 = DuckDBSuccess;
  }
  return local_4;
}

Assistant:

duckdb_state duckdb_connect(duckdb_database database, duckdb_connection *out) {
	if (!database || !out) {
		return DuckDBError;
	}

	auto wrapper = reinterpret_cast<DatabaseWrapper *>(database);
	Connection *connection;
	try {
		connection = new Connection(*wrapper->database);
	} catch (...) { // LCOV_EXCL_START
		return DuckDBError;
	} // LCOV_EXCL_STOP

	*out = reinterpret_cast<duckdb_connection>(connection);
	return DuckDBSuccess;
}